

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_inotify_poller.cc
# Opt level: O1

bool __thiscall RecursiveInotifyPoller::AddWatch(RecursiveInotifyPoller *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  long *plVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  iVar2 = (*this->ip_->_vptr_InotifyPoller[2])();
  if (SUB41(iVar2,0) != false) {
    __dirp = opendir((path->_M_dataplus)._M_p);
    if (__dirp != (DIR *)0x0) {
      pdVar4 = readdir(__dirp);
      if (pdVar4 != (dirent *)0x0) {
        do {
          if (pdVar4->d_type == '\x04') {
            iVar3 = strcmp(pdVar4->d_name,".");
            if (iVar3 != 0) {
              iVar3 = strcmp(pdVar4->d_name,"..");
              if (iVar3 != 0) {
                local_70 = local_60;
                pcVar1 = (path->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,pcVar1,pcVar1 + path->_M_string_length);
                std::__cxx11::string::append((char *)&local_70);
                plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                                           ((ulong)&local_70,local_68,0,'\x01');
                plVar6 = plVar5 + 2;
                if ((long *)*plVar5 == plVar6) {
                  local_40 = *plVar6;
                  uStack_38 = (undefined4)plVar5[3];
                  uStack_34 = *(undefined4 *)((long)plVar5 + 0x1c);
                  local_50 = &local_40;
                }
                else {
                  local_40 = *plVar6;
                  local_50 = (long *)*plVar5;
                }
                local_48 = plVar5[1];
                *plVar5 = (long)plVar6;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                (*(this->super_InotifyPoller)._vptr_InotifyPoller[2])(this,&local_50);
                if (local_50 != &local_40) {
                  operator_delete(local_50,local_40 + 1);
                }
                if (local_70 != local_60) {
                  operator_delete(local_70,local_60[0] + 1);
                }
              }
            }
          }
          pdVar4 = readdir(__dirp);
        } while (pdVar4 != (dirent *)0x0);
      }
      closedir(__dirp);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool RecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Add the path itself.
  if (!ip_->AddWatch(path))
    return false;

  // Recursive add all of its children.
  DIR* d = opendir(path.c_str());
  if (d != nullptr) {
    struct dirent* de;
    while ((de = readdir(d)) != nullptr) {
      if (de->d_type == DT_DIR && strcmp(de->d_name, ".") != 0 &&
          strcmp(de->d_name, "..") != 0)
        AddWatch(path + de->d_name + '/');
    }
    closedir(d);
  }
  return true;
}